

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_segment_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_128a39f::AqSegmentTest::~AqSegmentTest(AqSegmentTest *this)

{
  pointer pcVar1;
  
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_0103d9f8;
  pcVar1 = (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_EncoderTest).stats_.buffer_.field_2) {
    operator_delete(pcVar1);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~AqSegmentTest() override = default;